

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall TApp_RecoverSubcommands_Test::TestBody(TApp_RecoverSubcommands_Test *this)

{
  App *pAVar1;
  App *pAVar2;
  App *pAVar3;
  App *pAVar4;
  App *this_00;
  char *message;
  initializer_list<CLI::App_*> __l;
  allocator_type local_191;
  _Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> local_190;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  App *local_160;
  App *local_158;
  App *local_150;
  _Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> local_148;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"app1",(allocator *)&local_168);
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_190);
  this_00 = &(this->super_TApp).app;
  pAVar1 = CLI::App::add_subcommand(this_00,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_90,"app2",(allocator *)&local_168);
  std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&local_190);
  pAVar2 = CLI::App::add_subcommand(this_00,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_d0,"app3",(allocator *)&local_168);
  std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_190);
  pAVar3 = CLI::App::add_subcommand(this_00,&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_110,"app4",(allocator *)&local_168);
  message = "";
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)&local_190);
  pAVar4 = CLI::App::add_subcommand(this_00,&local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  CLI::App::get_subcommands
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_190,this_00,false);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_168;
  local_168.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar1
  ;
  local_160 = pAVar2;
  local_158 = pAVar3;
  local_150 = pAVar4;
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_148,__l,&local_191);
  testing::internal::
  CmpHelperEQ<std::vector<CLI::App*,std::allocator<CLI::App*>>,std::vector<CLI::App*,std::allocator<CLI::App*>>>
            ((internal *)&gtest_ar,"app.get_subcommands(false)",
             "std::vector<CLI::App *>({app1, app2, app3, app4})",
             (vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_190,
             (vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_148);
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_148);
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_190);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_168);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x4e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_168);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(TApp, RecoverSubcommands) {
    CLI::App *app1 = app.add_subcommand("app1");
    CLI::App *app2 = app.add_subcommand("app2");
    CLI::App *app3 = app.add_subcommand("app3");
    CLI::App *app4 = app.add_subcommand("app4");

    EXPECT_EQ(app.get_subcommands(false), std::vector<CLI::App *>({app1, app2, app3, app4}));
}